

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

void QLibraryStore::cleanup(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  QLibraryPrivate *pQVar3;
  type *t;
  type *ppQVar4;
  long in_FS_OFFSET;
  type *lib_1;
  type *__1;
  LibraryMap *__range2;
  type *lib;
  type *_;
  LibraryMap *__range1;
  QLibraryStore *data;
  iterator __end2;
  iterator __begin2;
  iterator __end1;
  iterator __begin1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  QLibraryPrivate *in_stack_ffffffffffffff00;
  QLibraryStore *pQVar5;
  QString *in_stack_ffffffffffffff08;
  QMessageLogger *in_stack_ffffffffffffff10;
  QMessageLogger *in_stack_ffffffffffffff18;
  QDebug *this;
  QDebug *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  QLibraryPrivate *in_stack_ffffffffffffff58;
  QDebug local_48;
  _Self local_40;
  _Self local_38;
  undefined8 local_30;
  _Self local_28;
  _Self local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  pQVar5 = qt_library_data;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (qt_library_data != (QLibraryStore *)0x0) {
    local_20._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_20._M_node =
         (_Base_ptr)
         std::
         map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
         ::begin((map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
                  *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_28._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
         ::end((map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
                *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    while (bVar1 = std::operator!=(&local_20,&local_28), bVar1) {
      std::_Rb_tree_iterator<std::pair<const_QString,_QLibraryPrivate_*>_>::operator*
                ((_Rb_tree_iterator<std::pair<const_QString,_QLibraryPrivate_*>_> *)
                 in_stack_ffffffffffffff00);
      std::get<0ul,QString_const,QLibraryPrivate*>
                ((pair<const_QString,_QLibraryPrivate_*> *)0x8c72a9);
      std::get<1ul,QString_const,QLibraryPrivate*>
                ((pair<const_QString,_QLibraryPrivate_*> *)0x8c72cd);
      iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x8c72e6);
      if (iVar2 == 1) {
        iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x8c7303);
        if (0 < iVar2) {
          QBasicAtomicInteger<int>::storeRelaxed
                    ((QBasicAtomicInteger<int> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc
                    );
          QLibraryPrivate::unload
                    (in_stack_ffffffffffffff58,
                     (UnloadFlag)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        }
        local_30 = 0;
        pQVar3 = std::exchange<QLibraryPrivate*,decltype(nullptr)>
                           ((QLibraryPrivate **)in_stack_ffffffffffffff00,
                            (void **)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        if (pQVar3 != (QLibraryPrivate *)0x0) {
          QLibraryPrivate::~QLibraryPrivate(in_stack_ffffffffffffff00);
          operator_delete(pQVar3,0xb0);
        }
      }
      std::_Rb_tree_iterator<std::pair<const_QString,_QLibraryPrivate_*>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_QString,_QLibraryPrivate_*>_> *)
                 in_stack_ffffffffffffff00);
    }
    lcDebugLibrary();
    bVar1 = QLoggingCategory::isDebugEnabled((QLoggingCategory *)0x8c7395);
    if (bVar1) {
      local_38._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
      local_38._M_node =
           (_Base_ptr)
           std::
           map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
           ::begin((map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
                    *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      local_40._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
      local_40._M_node =
           (_Base_ptr)
           std::
           map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
           ::end((map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
                  *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      while (bVar1 = std::operator!=(&local_38,&local_40), bVar1) {
        std::_Rb_tree_iterator<std::pair<const_QString,_QLibraryPrivate_*>_>::operator*
                  ((_Rb_tree_iterator<std::pair<const_QString,_QLibraryPrivate_*>_> *)
                   in_stack_ffffffffffffff00);
        t = std::get<0ul,QString_const,QLibraryPrivate*>
                      ((pair<const_QString,_QLibraryPrivate_*> *)0x8c7454);
        ppQVar4 = std::get<1ul,QString_const,QLibraryPrivate*>
                            ((pair<const_QString,_QLibraryPrivate_*> *)0x8c7472);
        if (*ppQVar4 != (type)0x0) {
          local_18 = &DAT_aaaaaaaaaaaaaaaa;
          local_10 = &DAT_aaaaaaaaaaaaaaaa;
          lcDebugLibrary();
          anon_unknown.dwarf_146765a::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff00,
                     (QLoggingCategory *)
                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
            anon_unknown.dwarf_146765a::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x8c74dc);
            QMessageLogger::QMessageLogger
                      (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                       (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (char *)0x8c74f8);
            this = &local_48;
            QMessageLogger::debug(in_stack_ffffffffffffff18);
            QDebug::operator<<(this,(char *)t);
            in_stack_ffffffffffffff18 =
                 (QMessageLogger *)
                 QDebug::operator<<((QDebug *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            in_stack_ffffffffffffff10 = (QMessageLogger *)QDebug::operator<<(this,(char *)t);
            QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x8c756c);
            in_stack_ffffffffffffff08 =
                 (QString *)
                 QDebug::operator<<((QDebug *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
            QDebug::operator<<(this,(char *)t);
            QDebug::~QDebug(in_stack_ffffffffffffff48);
            local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
          }
        }
        std::_Rb_tree_iterator<std::pair<const_QString,_QLibraryPrivate_*>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_QString,_QLibraryPrivate_*>_> *)
                   in_stack_ffffffffffffff00);
      }
    }
    if (pQVar5 != (QLibraryStore *)0x0) {
      ~QLibraryStore((QLibraryStore *)0x8c7602);
      operator_delete(pQVar5,0x30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QLibraryStore::cleanup()
{
    QLibraryStore *data = qt_library_data;
    if (!data)
        return;

    // find any libraries that are still loaded but have a no one attached to them
    for (auto &[_, lib] : data->libraryMap) {
        if (lib->libraryRefCount.loadRelaxed() == 1) {
            if (lib->libraryUnloadCount.loadRelaxed() > 0) {
                Q_ASSERT(lib->pHnd.loadRelaxed());
                lib->libraryUnloadCount.storeRelaxed(1);
#if defined(Q_OS_DARWIN)
                // We cannot fully unload libraries, as we don't know if there are
                // lingering references (in system threads e.g.) to Objective-C classes
                // defined in the library.
                lib->unload(QLibraryPrivate::NoUnloadSys);
#else
                lib->unload();
#endif
            }
            delete std::exchange(lib, nullptr);
        }
    }

    // dump all objects that remain
    if (lcDebugLibrary().isDebugEnabled()) {
        for (auto &[_, lib] : data->libraryMap) {
            if (lib)
                qCDebug(lcDebugLibrary)
                        << "On QtCore unload," << lib->fileName << "was leaked, with"
                        << lib->libraryRefCount.loadRelaxed() << "users";
        }
    }

    delete data;
}